

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextClassifier.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CoreMLModels::TextClassifier::TextClassifier
          (TextClassifier *this,TextClassifier *from)

{
  InternalMetadata *this_00;
  StringVector *this_01;
  undefined8 *puVar1;
  ulong uVar2;
  undefined1 *from_00;
  Arena *arena;
  
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__TextClassifier_004bc500;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar2 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (this_00,(string *)((uVar2 & 0xfffffffffffffffc) + 8));
  }
  (this->language_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (ulong)(from->language_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar2 + 8) != 0) {
    puVar1 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->language_,uVar2,puVar1);
  }
  (this->modelparameterdata_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (ulong)(from->modelparameterdata_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar2 + 8) != 0) {
    puVar1 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->modelparameterdata_,uVar2,puVar1);
  }
  this->revision_ = from->revision_;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 200) {
    clear_ClassLabels(this);
    this->_oneof_case_[0] = 200;
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    this_01 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                        (arena);
    (this->ClassLabels_).stringclasslabels_ = this_01;
    if (from->_oneof_case_[0] == 200) {
      from_00 = (undefined1 *)(from->ClassLabels_).stringclasslabels_;
    }
    else {
      from_00 = _StringVector_default_instance_;
    }
    StringVector::MergeFrom(this_01,(StringVector *)from_00);
  }
  return;
}

Assistant:

TextClassifier::TextClassifier(const TextClassifier& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  language_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    language_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_language().empty()) {
    language_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_language(), 
      GetArenaForAllocation());
  }
  modelparameterdata_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    modelparameterdata_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_modelparameterdata().empty()) {
    modelparameterdata_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_modelparameterdata(), 
      GetArenaForAllocation());
  }
  revision_ = from.revision_;
  clear_has_ClassLabels();
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      _internal_mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from._internal_stringclasslabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CoreMLModels.TextClassifier)
}